

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O2

StructuredAssignmentPatternExpression * __thiscall
slang::BumpAllocator::
emplace<slang::ast::StructuredAssignmentPatternExpression,slang::ast::Type_const&,nonstd::span_lite::span<slang::ast::StructuredAssignmentPatternExpression::MemberSetter_const,18446744073709551615ul>,nonstd::span_lite::span<slang::ast::StructuredAssignmentPatternExpression::TypeSetter,18446744073709551615ul>,nonstd::span_lite::span<slang::ast::StructuredAssignmentPatternExpression::IndexSetter,18446744073709551615ul>,slang::ast::Expression_const*&,nonstd::span_lite::span<slang::ast::Expression_const*,18446744073709551615ul>,slang::SourceRange&>
          (BumpAllocator *this,Type *args,
          span<const_slang::ast::StructuredAssignmentPatternExpression::MemberSetter,_18446744073709551615UL>
          *args_1,span<slang::ast::StructuredAssignmentPatternExpression::TypeSetter,_18446744073709551615UL>
                  *args_2,
          span<slang::ast::StructuredAssignmentPatternExpression::IndexSetter,_18446744073709551615UL>
          *args_3,Expression **args_4,
          span<const_slang::ast::Expression_*,_18446744073709551615UL> *args_5,SourceRange *args_6)

{
  Expression *pEVar1;
  pointer pMVar2;
  size_type sVar3;
  pointer pTVar4;
  size_type sVar5;
  pointer pIVar6;
  size_type sVar7;
  pointer ppEVar8;
  size_type sVar9;
  StructuredAssignmentPatternExpression *this_00;
  
  this_00 = (StructuredAssignmentPatternExpression *)allocate(this,0x78,8);
  pMVar2 = args_1->data_;
  sVar3 = args_1->size_;
  pTVar4 = args_2->data_;
  sVar5 = args_2->size_;
  pIVar6 = args_3->data_;
  sVar7 = args_3->size_;
  pEVar1 = *args_4;
  ppEVar8 = args_5->data_;
  sVar9 = args_5->size_;
  ast::Expression::Expression((Expression *)this_00,StructuredAssignmentPattern,args,*args_6);
  (this_00->super_AssignmentPatternExpressionBase).elements_.data_ = ppEVar8;
  (this_00->super_AssignmentPatternExpressionBase).elements_.size_ = sVar9;
  (this_00->memberSetters).data_ = pMVar2;
  (this_00->memberSetters).size_ = sVar3;
  (this_00->typeSetters).data_ = pTVar4;
  (this_00->typeSetters).size_ = sVar5;
  (this_00->indexSetters).data_ = pIVar6;
  (this_00->indexSetters).size_ = sVar7;
  this_00->defaultSetter = pEVar1;
  return this_00;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }